

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ConvertTransformOrder_TRStoSRT
          (FBXConverter *this,aiQuatKey *out_quat,aiVectorKey *out_scale,
          aiVectorKey *out_translation,KeyFrameListList *scaling,KeyFrameListList *translation,
          KeyFrameListList *rotation,KeyTimeList *times,double *maxTime,double *minTime,
          RotOrder order,aiVector3D *def_scale,aiVector3D *def_translate,aiVector3D *def_rotation)

{
  float fVar1;
  size_type sVar2;
  const_reference pvVar3;
  aiQuaternion *paVar4;
  aiMatrix4x4t<float> *m;
  aiQuaternion aVar5;
  aiMatrix3x3t<float> local_16c;
  aiMatrix4x4t<float> local_148;
  undefined1 local_108 [8];
  aiMatrix4x4 temp;
  aiMatrix4x4 mat;
  aiVector3D *t;
  aiVector3D *s;
  aiQuaternion *r;
  size_t i_3;
  size_t count;
  size_t i_2;
  size_t i_1;
  undefined8 local_48;
  ulong local_40;
  size_t i;
  KeyFrameListList *translation_local;
  KeyFrameListList *scaling_local;
  aiVectorKey *out_translation_local;
  aiVectorKey *out_scale_local;
  aiQuatKey *out_quat_local;
  FBXConverter *this_local;
  
  sVar2 = std::
          vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
          ::size(rotation);
  if (sVar2 == 0) {
    for (local_40 = 0; sVar2 = std::vector<long,_std::allocator<long>_>::size(times),
        local_40 < sVar2; local_40 = local_40 + 1) {
      pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](times,local_40);
      out_quat[local_40].mTime = ((double)*pvVar3 / 46186158000.0) * this->anim_fps;
      aVar5 = EulerToQuaternion(this,def_rotation,order);
      i_1 = aVar5._0_8_;
      out_quat[local_40].mValue.w = (float)(undefined4)i_1;
      out_quat[local_40].mValue.x = (float)i_1._4_4_;
      local_48 = aVar5._8_8_;
      out_quat[local_40].mValue.y = (float)(undefined4)local_48;
      out_quat[local_40].mValue.z = (float)local_48._4_4_;
    }
  }
  else {
    InterpolateKeys(this,out_quat,times,rotation,def_rotation,maxTime,minTime,order);
  }
  sVar2 = std::
          vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
          ::size(scaling);
  if (sVar2 == 0) {
    for (i_2 = 0; sVar2 = std::vector<long,_std::allocator<long>_>::size(times), i_2 < sVar2;
        i_2 = i_2 + 1) {
      pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](times,i_2);
      out_scale[i_2].mTime = ((double)*pvVar3 / 46186158000.0) * this->anim_fps;
      fVar1 = def_scale->y;
      out_scale[i_2].mValue.x = def_scale->x;
      out_scale[i_2].mValue.y = fVar1;
      out_scale[i_2].mValue.z = def_scale->z;
    }
  }
  else {
    InterpolateKeys(this,out_scale,times,scaling,def_scale,maxTime,minTime);
  }
  sVar2 = std::
          vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
          ::size(translation);
  if (sVar2 == 0) {
    for (count = 0; sVar2 = std::vector<long,_std::allocator<long>_>::size(times), count < sVar2;
        count = count + 1) {
      pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](times,count);
      out_translation[count].mTime = ((double)*pvVar3 / 46186158000.0) * this->anim_fps;
      fVar1 = def_translate->y;
      out_translation[count].mValue.x = def_translate->x;
      out_translation[count].mValue.y = fVar1;
      out_translation[count].mValue.z = def_translate->z;
    }
  }
  else {
    InterpolateKeys(this,out_translation,times,translation,def_translate,maxTime,minTime);
  }
  paVar4 = (aiQuaternion *)std::vector<long,_std::allocator<long>_>::size(times);
  for (r = (aiQuaternion *)0x0; r < paVar4; r = (aiQuaternion *)((long)&r->w + 1)) {
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&temp.d3);
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_108);
    aiMatrix4x4t<float>::Translation
              (&out_translation[(long)r].mValue,(aiMatrix4x4t<float> *)&temp.d3);
    aiQuaterniont<float>::GetMatrix(&local_16c,&out_quat[(long)r].mValue);
    aiMatrix4x4t<float>::aiMatrix4x4t(&local_148,&local_16c);
    aiMatrix4x4t<float>::operator*=((aiMatrix4x4t<float> *)&temp.d3,&local_148);
    m = aiMatrix4x4t<float>::Scaling(&out_scale[(long)r].mValue,(aiMatrix4x4t<float> *)local_108);
    aiMatrix4x4t<float>::operator*=((aiMatrix4x4t<float> *)&temp.d3,m);
    aiMatrix4x4t<float>::Decompose
              ((aiMatrix4x4t<float> *)&temp.d3,&out_scale[(long)r].mValue,&out_quat[(long)r].mValue,
               &out_translation[(long)r].mValue);
  }
  return;
}

Assistant:

void FBXConverter::ConvertTransformOrder_TRStoSRT(aiQuatKey* out_quat, aiVectorKey* out_scale,
            aiVectorKey* out_translation,
            const KeyFrameListList& scaling,
            const KeyFrameListList& translation,
            const KeyFrameListList& rotation,
            const KeyTimeList& times,
            double& maxTime,
            double& minTime,
            Model::RotOrder order,
            const aiVector3D& def_scale,
            const aiVector3D& def_translate,
            const aiVector3D& def_rotation)
        {
            if (rotation.size()) {
                InterpolateKeys(out_quat, times, rotation, def_rotation, maxTime, minTime, order);
            }
            else {
                for (size_t i = 0; i < times.size(); ++i) {
                    out_quat[i].mTime = CONVERT_FBX_TIME(times[i]) * anim_fps;
                    out_quat[i].mValue = EulerToQuaternion(def_rotation, order);
                }
            }

            if (scaling.size()) {
                InterpolateKeys(out_scale, times, scaling, def_scale, maxTime, minTime);
            }
            else {
                for (size_t i = 0; i < times.size(); ++i) {
                    out_scale[i].mTime = CONVERT_FBX_TIME(times[i]) * anim_fps;
                    out_scale[i].mValue = def_scale;
                }
            }

            if (translation.size()) {
                InterpolateKeys(out_translation, times, translation, def_translate, maxTime, minTime);
            }
            else {
                for (size_t i = 0; i < times.size(); ++i) {
                    out_translation[i].mTime = CONVERT_FBX_TIME(times[i]) * anim_fps;
                    out_translation[i].mValue = def_translate;
                }
            }

            const size_t count = times.size();
            for (size_t i = 0; i < count; ++i) {
                aiQuaternion& r = out_quat[i].mValue;
                aiVector3D& s = out_scale[i].mValue;
                aiVector3D& t = out_translation[i].mValue;

                aiMatrix4x4 mat, temp;
                aiMatrix4x4::Translation(t, mat);
                mat *= aiMatrix4x4(r.GetMatrix());
                mat *= aiMatrix4x4::Scaling(s, temp);

                mat.Decompose(s, r, t);
            }
        }